

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

void xemmai::ast::anon_unknown_11::f_emit_block
               (t_emit *a_emit,
               vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
               *a_nodes,bool a_tail,bool a_clear,bool a_preserve)

{
  pointer puVar1;
  t_node *ptVar2;
  pointer puVar3;
  
  puVar3 = (a_nodes->
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (a_nodes->
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    while( true ) {
      ptVar2 = (puVar3->_M_t).
               super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
               .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
      if (puVar3 == puVar1 + -1) break;
      (*ptVar2->_vptr_t_node[3])(ptVar2,a_emit,0,0,1);
      puVar3 = puVar3 + 1;
    }
    (*ptVar2->_vptr_t_node[3])(ptVar2,a_emit,a_tail,0,a_clear);
    return;
  }
  if (a_clear) {
    return;
  }
  if (a_preserve) {
    t_emit::f_push(a_emit);
    return;
  }
  t_emit::f_emit_null(a_emit);
  return;
}

Assistant:

void f_emit_block(t_emit& a_emit, const std::vector<std::unique_ptr<t_node>>& a_nodes, bool a_tail, bool a_clear, bool a_preserve = false)
{
	auto i = a_nodes.begin();
	auto j = a_nodes.end();
	if (i == j) {
		if (!a_clear) a_preserve ? a_emit.f_push() : a_emit.f_emit_null();
	} else {
		for (--j; i != j; ++i) (*i)->f_emit(a_emit, false, false, true);
		(*i)->f_emit(a_emit, a_tail, false, a_clear);
	}
}